

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O1

Error __thiscall
llvm::DWARFListType<llvm::RangeListEntry>::extract
          (DWARFListType<llvm::RangeListEntry> *this,DWARFDataExtractor Data,uint64_t HeaderOffset,
          uint64_t End,uint64_t *OffsetPtr,StringRef SectionName,StringRef ListTypeString)

{
  uint64_t *puVar1;
  iterator __position;
  ulong uVar2;
  char *Fmt;
  char *Vals;
  error_category *peVar3;
  ulong *puVar4;
  error_code EC;
  char *in_stack_00000040;
  undefined1 auStack_60 [8];
  RangeListEntry Entry;
  uint64_t HeaderOffset_local;
  
  puVar4 = (ulong *)SectionName.Data;
  Entry.Value1 = End;
  if ((uint64_t *)*puVar4 < End || OffsetPtr <= (uint64_t *)*puVar4) {
    Fmt = (char *)std::_V2::generic_category();
    auStack_60 = (undefined1  [8])in_stack_00000040;
    Vals = "invalid %s list offset 0x%lx";
    peVar3 = (error_category *)0x16;
  }
  else {
    if (*(long *)(HeaderOffset + 8) != *(long *)HeaderOffset) {
      *(long *)(HeaderOffset + 8) = *(long *)HeaderOffset;
    }
    puVar1 = (uint64_t *)*puVar4;
    while (puVar1 < OffsetPtr) {
      RangeListEntry::extract((RangeListEntry *)this,Data,(uint64_t)auStack_60,OffsetPtr);
      uVar2 = (ulong)(this->Entries).
                     super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start & 0xfffffffffffffffe;
      (this->Entries).
      super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(uVar2 != 0 | uVar2);
      if (uVar2 != 0) {
        return (Error)(ErrorInfoBase *)this;
      }
      __position._M_current = *(RangeListEntry **)(HeaderOffset + 8);
      if (__position._M_current == *(RangeListEntry **)(HeaderOffset + 0x10)) {
        std::vector<llvm::RangeListEntry,std::allocator<llvm::RangeListEntry>>::
        _M_realloc_insert<llvm::RangeListEntry_const&>
                  ((vector<llvm::RangeListEntry,std::allocator<llvm::RangeListEntry>> *)HeaderOffset
                   ,__position,(RangeListEntry *)auStack_60);
      }
      else {
        (__position._M_current)->Value1 = Entry.Value0;
        ((__position._M_current)->super_DWARFListEntryBase).SectionIndex =
             Entry.super_DWARFListEntryBase._8_8_;
        (__position._M_current)->Value0 = Entry.super_DWARFListEntryBase.SectionIndex;
        ((__position._M_current)->super_DWARFListEntryBase).Offset = (uint64_t)auStack_60;
        *(ulong *)&((__position._M_current)->super_DWARFListEntryBase).EntryKind =
             CONCAT71(Entry.super_DWARFListEntryBase.Offset._1_7_,
                      (char)Entry.super_DWARFListEntryBase.Offset);
        *(long *)(HeaderOffset + 8) = *(long *)(HeaderOffset + 8) + 0x28;
      }
      if ((char)Entry.super_DWARFListEntryBase.Offset == '\0') {
        (this->Entries).
        super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x1;
        return (Error)(ErrorInfoBase *)this;
      }
      puVar1 = (uint64_t *)*puVar4;
    }
    Fmt = (char *)std::_V2::generic_category();
    auStack_60 = (undefined1  [8])ListTypeString.Data;
    Vals = "no end of list marker detected at end of %s table starting at offset 0x%lx";
    peVar3 = (error_category *)0x54;
  }
  EC._M_cat = peVar3;
  EC._0_8_ = this;
  createStringError<char_const*,unsigned_long>(EC,Fmt,(char **)Vals,(unsigned_long *)auStack_60);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFListType<ListEntryType>::extract(DWARFDataExtractor Data,
                                            uint64_t HeaderOffset, uint64_t End,
                                            uint64_t *OffsetPtr,
                                            StringRef SectionName,
                                            StringRef ListTypeString) {
  if (*OffsetPtr < HeaderOffset || *OffsetPtr >= End)
    return createStringError(errc::invalid_argument,
                       "invalid %s list offset 0x%" PRIx64,
                       ListTypeString.data(), *OffsetPtr);
  Entries.clear();
  while (*OffsetPtr < End) {
    ListEntryType Entry;
    if (Error E = Entry.extract(Data, End, OffsetPtr))
      return E;
    Entries.push_back(Entry);
    if (Entry.isSentinel())
      return Error::success();
  }
  return createStringError(errc::illegal_byte_sequence,
                     "no end of list marker detected at end of %s table "
                     "starting at offset 0x%" PRIx64,
                     SectionName.data(), HeaderOffset);
}